

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmCommonTargetGenerator::GetIncludes
          (string *__return_storage_ptr__,cmCommonTargetGenerator *this,string *l)

{
  bool bVar1;
  pointer ppVar2;
  __enable_if_t<is_constructible<value_type,_pair<const_basic_string<char>,_basic_string<char>_>_&>::value,_pair<iterator,_bool>_>
  _Var3;
  undefined1 local_a0 [8];
  value_type entry;
  undefined1 local_50 [8];
  string includes;
  _Self local_28;
  iterator i;
  string *l_local;
  cmCommonTargetGenerator *this_local;
  
  i._M_node = (_Base_ptr)l;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->IncludesByLanguage,l);
  includes.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->IncludesByLanguage);
  bVar1 = std::operator==(&local_28,(_Self *)((long)&includes.field_2 + 8));
  if (bVar1) {
    std::__cxx11::string::string((string *)local_50);
    (*this->_vptr_cmCommonTargetGenerator[3])(this,(string *)local_50,i._M_node);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)i._M_node,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    _Var3 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string_const,std::__cxx11::string>&>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&this->IncludesByLanguage,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_a0);
    local_28._M_node = (_Base_ptr)_Var3.first._M_node;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_a0);
    std::__cxx11::string::~string((string *)local_50);
  }
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_28);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar2->second);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCommonTargetGenerator::GetIncludes(std::string const& l)
{
  ByLanguageMap::iterator i = this->IncludesByLanguage.find(l);
  if (i == this->IncludesByLanguage.end())
    {
    std::string includes;
    this->AddIncludeFlags(includes, l);
    ByLanguageMap::value_type entry(l, includes);
    i = this->IncludesByLanguage.insert(entry).first;
    }
  return i->second;
}